

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

UniValue *
JSONRPCReplyObj(UniValue *result,UniValue *error,optional<UniValue> *id,
               JSONRPCVersion jsonrpc_version)

{
  undefined1 uVar1;
  bool bVar2;
  UniValue *pUVar3;
  UniValue *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  UniValue *reply;
  UniValue *in_stack_fffffffffffffc38;
  UniValue *in_stack_fffffffffffffc40;
  UniValue *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  UniValue *in_stack_fffffffffffffc58;
  UniValue *in_stack_fffffffffffffc60;
  UniValue *in_stack_fffffffffffffc68;
  UniValue *in_stack_fffffffffffffc70;
  string *in_stack_fffffffffffffc78;
  UniValue *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  allocator<char> local_2fe;
  allocator<char> local_2fd;
  undefined1 local_2fc;
  undefined1 local_2fb;
  undefined1 local_2fa [2];
  UniValue local_2f8 [5];
  string local_118 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_fffffffffffffc50);
  UniValue::UniValue(in_stack_fffffffffffffc58,(VType)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                     (string *)in_stack_fffffffffffffc48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc38);
  if (in_R8D == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
               (char *)in_stack_fffffffffffffc80,(allocator<char> *)in_stack_fffffffffffffc78);
    UniValue::UniValue<const_char_(&)[4],_char[4],_true>
              (in_stack_fffffffffffffc80,(char (*) [4])in_stack_fffffffffffffc78);
    UniValue::pushKV(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    UniValue::~UniValue(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::allocator<char>::~allocator((allocator<char> *)(local_2fa + 1));
  }
  uVar1 = UniValue::isNull(in_stack_fffffffffffffc38);
  if ((bool)uVar1) {
    in_stack_fffffffffffffc80 = (UniValue *)local_2fa;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffc88),(char *)in_stack_fffffffffffffc80,
               (allocator<char> *)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = local_118;
    UniValue::UniValue(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    UniValue::pushKV(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    UniValue::~UniValue(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::allocator<char>::~allocator((allocator<char> *)local_2fa);
    if (in_R8D == 0) {
      in_stack_fffffffffffffc70 = (UniValue *)&local_2fb;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffc88),(char *)in_stack_fffffffffffffc80,
                 (allocator<char> *)in_stack_fffffffffffffc78);
      UniValue::UniValue(in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      UniValue::pushKV(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70
                      );
      UniValue::~UniValue(in_stack_fffffffffffffc38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc38);
      std::allocator<char>::~allocator((allocator<char> *)&local_2fb);
    }
  }
  else {
    if (in_R8D == 0) {
      pUVar3 = (UniValue *)&local_2fc;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffc88),(char *)in_stack_fffffffffffffc80,
                 (allocator<char> *)in_stack_fffffffffffffc78);
      UniValue::UniValue(pUVar3,in_stack_fffffffffffffc60);
      UniValue::pushKV(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70
                      );
      UniValue::~UniValue(in_stack_fffffffffffffc38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc38);
      std::allocator<char>::~allocator((allocator<char> *)&local_2fc);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffc88),(char *)in_stack_fffffffffffffc80,
               (allocator<char> *)in_stack_fffffffffffffc78);
    UniValue::UniValue(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    UniValue::pushKV(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    UniValue::~UniValue(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::allocator<char>::~allocator(&local_2fd);
  }
  bVar2 = std::optional<UniValue>::has_value((optional<UniValue> *)in_stack_fffffffffffffc38);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_fffffffffffffc88),(char *)in_stack_fffffffffffffc80,
               (allocator<char> *)in_stack_fffffffffffffc78);
    pUVar3 = std::optional<UniValue>::value((optional<UniValue> *)in_stack_fffffffffffffc48);
    UniValue::UniValue(pUVar3,local_2f8);
    UniValue::pushKV(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    UniValue::~UniValue(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc38);
    std::allocator<char>::~allocator(&local_2fe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCReplyObj(UniValue result, UniValue error, std::optional<UniValue> id, JSONRPCVersion jsonrpc_version)
{
    UniValue reply(UniValue::VOBJ);
    // Add JSON-RPC version number field in v2 only.
    if (jsonrpc_version == JSONRPCVersion::V2) reply.pushKV("jsonrpc", "2.0");

    // Add both result and error fields in v1, even though one will be null.
    // Omit the null field in v2.
    if (error.isNull()) {
        reply.pushKV("result", std::move(result));
        if (jsonrpc_version == JSONRPCVersion::V1_LEGACY) reply.pushKV("error", NullUniValue);
    } else {
        if (jsonrpc_version == JSONRPCVersion::V1_LEGACY) reply.pushKV("result", NullUniValue);
        reply.pushKV("error", std::move(error));
    }
    if (id.has_value()) reply.pushKV("id", std::move(id.value()));
    return reply;
}